

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMarkAsAdvancedCommand.cxx
# Opt level: O0

bool __thiscall
cmMarkAsAdvancedCommand::InitialPass
          (cmMarkAsAdvancedCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmState *pcVar1;
  cmState *pcVar2;
  bool bVar3;
  const_reference pvVar4;
  ulong uVar5;
  size_type sVar6;
  char *pcVar7;
  cmake *this_00;
  byte local_131;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  cmState *local_80;
  cmState *state;
  string *variable;
  char *pcStack_68;
  bool overwrite;
  char *value;
  uint i;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmMarkAsAdvancedCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    return false;
  }
  value._0_4_ = 0;
  pcStack_68 = "1";
  variable._7_1_ = 0;
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,0);
  bVar3 = std::operator==(pvVar4,"CLEAR");
  if (!bVar3) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,0);
    bVar3 = std::operator==(pvVar4,"FORCE");
    if (!bVar3) goto LAB_005a9f9d;
  }
  variable._7_1_ = 1;
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,0);
  bVar3 = std::operator==(pvVar4,"CLEAR");
  if (bVar3) {
    pcStack_68 = "0";
  }
  value._0_4_ = 1;
LAB_005a9f9d:
  while( true ) {
    uVar5 = (ulong)(uint)value;
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
    if (sVar6 <= uVar5) {
      return true;
    }
    state = (cmState *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local,(ulong)(uint)value);
    local_80 = cmMakefile::GetState((this->super_cmCommand).Makefile);
    pcVar7 = cmState::GetCacheEntryValue(local_80,(string *)state);
    if (pcVar7 == (char *)0x0) {
      this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
      cmake::AddCacheEntry(this_00,(string *)state,(char *)0x0,(char *)0x0,6);
      variable._7_1_ = 1;
    }
    pcVar7 = cmState::GetCacheEntryValue(local_80,(string *)state);
    pcVar2 = state;
    pcVar1 = local_80;
    if (pcVar7 == (char *)0x0) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,"ADVANCED",&local_a1);
    pcVar7 = cmState::GetCacheEntryProperty(pcVar1,(string *)pcVar2,&local_a0);
    local_131 = 1;
    if (pcVar7 != (char *)0x0) {
      local_131 = variable._7_1_;
    }
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    pcVar2 = state;
    pcVar1 = local_80;
    if ((local_131 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c8,"ADVANCED",&local_c9);
      pcVar7 = pcStack_68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f0,pcVar7,&local_f1);
      cmState::SetCacheEntryProperty(pcVar1,(string *)pcVar2,&local_c8,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    }
    value._0_4_ = (uint)value + 1;
  }
  cmSystemTools::Error("This should never happen...",(char *)0x0,(char *)0x0,(char *)0x0);
  return false;
}

Assistant:

bool cmMarkAsAdvancedCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  unsigned int i = 0;
  const char* value = "1";
  bool overwrite = false;
  if (args[0] == "CLEAR" || args[0] == "FORCE") {
    overwrite = true;
    if (args[0] == "CLEAR") {
      value = "0";
    }
    i = 1;
  }
  for (; i < args.size(); ++i) {
    std::string const& variable = args[i];
    cmState* state = this->Makefile->GetState();
    if (!state->GetCacheEntryValue(variable)) {
      this->Makefile->GetCMakeInstance()->AddCacheEntry(
        variable, CM_NULLPTR, CM_NULLPTR, cmStateEnums::UNINITIALIZED);
      overwrite = true;
    }
    if (!state->GetCacheEntryValue(variable)) {
      cmSystemTools::Error("This should never happen...");
      return false;
    }
    if (!state->GetCacheEntryProperty(variable, "ADVANCED") || overwrite) {
      state->SetCacheEntryProperty(variable, "ADVANCED", value);
    }
  }
  return true;
}